

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadContributorInfo(ColladaParser *this)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_31;
  string local_30;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar1 == '\0') {
    do {
      while( true ) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar1 == '\0') {
          return;
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 != 1) break;
        ReadMetaDataItem(this,&this->mAssetMetaData);
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar1 != 2);
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"contributor");
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Expected end of <contributor> element.",&local_31);
      ThrowException(this,&local_30);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadContributorInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            ReadMetaDataItem(mAssetMetaData);
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "contributor") != 0)
                ThrowException("Expected end of <contributor> element.");
            break;
        }
    }
}